

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
::dx(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
     *this,int i)

{
  Fad<double> *this_00;
  long in_RSI;
  Fad<Fad<double>_> *in_RDI;
  FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
  *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int i_00;
  Fad<Fad<double>_> *this_01;
  Fad<double> *in_stack_ffffffffffffff70;
  Fad<double> *in_stack_ffffffffffffff78;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff88;
  Fad<double> *in_stack_ffffffffffffff90;
  
  this_01 = in_RDI;
  FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
  ::dx((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
        *)in_RDI,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  i_00 = (int)((ulong)in_RDI >> 0x20);
  Fad<Fad<double>_>::val(*(Fad<Fad<double>_> **)(in_RSI + 8));
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  this_00 = Fad<Fad<double>_>::dx(this_01,i_00);
  FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
  ::val(in_stack_ffffffffffffff38);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff78,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff70);
  Fad<double>::
  Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  return (value_type *)this_01;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}